

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

CommaSeparatedList * __thiscall
soul::StructuralParser::parseCommaSeparatedListOfExpressions
          (StructuralParser *this,bool canContainTypes,bool canContainProcessors)

{
  Statement *pSVar1;
  bool bVar2;
  CommaSeparatedList *pCVar3;
  size_t sVar4;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this_00;
  pool_ref<soul::AST::Expression> local_108;
  CompileMessage local_100;
  CompileMessage local_c8;
  CompileMessage local_90;
  Expression *local_58;
  Expression *e;
  Context local_38;
  CommaSeparatedList *local_20;
  CommaSeparatedList *list;
  bool canContainProcessors_local;
  StructuralParser *pSStack_10;
  bool canContainTypes_local;
  StructuralParser *this_local;
  
  list._6_1_ = canContainProcessors;
  list._7_1_ = canContainTypes;
  pSStack_10 = this;
  getContext(&local_38,this);
  pCVar3 = allocate<soul::AST::CommaSeparatedList,soul::AST::Context>(this,&local_38);
  AST::Context::~Context(&local_38);
  e = (Expression *)0x571824;
  local_20 = pCVar3;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
  if (!bVar2) {
    while( true ) {
      local_58 = parseExpression(this,false);
      sVar4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                        (&local_20->items);
      if (0xffff < sVar4) {
        pSVar1 = &local_58->super_Statement;
        Errors::tooManyInitialisers<>();
        AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_90,false);
      }
      if (((list._7_1_ & 1) == 0) && (local_58->kind == type)) {
        pSVar1 = &local_58->super_Statement;
        Errors::typeReferenceNotAllowed<>();
        AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_c8,false);
      }
      if (((list._6_1_ & 1) == 0) && (local_58->kind == processor)) {
        pSVar1 = &local_58->super_Statement;
        Errors::processorReferenceNotAllowed<>();
        AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_100,false);
      }
      this_00 = &local_20->items;
      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_108,local_58);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (this_00,&local_108);
      pool_ref<soul::AST::Expression>::~pool_ref(&local_108);
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x571824);
      if (bVar2) break;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    }
  }
  return local_20;
}

Assistant:

AST::CommaSeparatedList& parseCommaSeparatedListOfExpressions (bool canContainTypes, bool canContainProcessors)
    {
        auto& list = allocate<AST::CommaSeparatedList> (getContext());

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                auto& e = parseExpression();

                if (list.items.size() >= AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (! canContainTypes && e.kind == AST::ExpressionKind::type)
                    e.context.throwError (Errors::typeReferenceNotAllowed());

                if (! canContainProcessors && e.kind == AST::ExpressionKind::processor)
                    e.context.throwError (Errors::processorReferenceNotAllowed());

                list.items.push_back (e);

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        return list;
    }